

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.h
# Opt level: O0

void __thiscall Http_Handle::Http_Handle(Http_Handle *this)

{
  Http_Handle *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_version);
  std::__cxx11::string::string((string *)&this->URI);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->request_head);
  std::__cxx11::string::string((string *)&this->request_body);
  std::__cxx11::string::operator=((string *)this,"");
  std::__cxx11::string::operator=((string *)&this->_version,"");
  std::__cxx11::string::operator=((string *)&this->URI,"");
  return;
}

Assistant:

Http_Handle()
    {
        Req = "";
        _version = "";
        URI = "";
    }